

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LSTM.cpp
# Opt level: O1

void CoreMLConverter::convertCaffeLSTM(ConvertLayerParameters layerParameters)

{
  RepeatedField<unsigned_long> *this;
  RepeatedField<float> *pRVar1;
  ulong *puVar2;
  string *psVar3;
  ConvolutionLayerParams *pCVar4;
  long lVar5;
  long lVar6;
  Rep *pRVar7;
  Arena *pAVar8;
  bool bVar9;
  char cVar10;
  int iVar11;
  Type *pTVar12;
  Type *pTVar13;
  Type *this_00;
  LogMessage *pLVar14;
  long *plVar15;
  mapped_type *pmVar16;
  UniDirectionalLSTMLayerParams *this_01;
  LSTMParams *pLVar17;
  Type *pTVar18;
  ActivationSigmoid *this_02;
  ActivationTanh *pAVar19;
  LSTMWeightParams *pLVar20;
  WeightParams *pWVar21;
  float *pfVar22;
  uint uVar23;
  size_type *psVar24;
  int **ppiVar25;
  ulong *puVar26;
  unsigned_long uVar27;
  ulong uVar28;
  ulong uVar29;
  undefined8 *puVar30;
  uint uVar31;
  char *pcVar32;
  uint uVar33;
  uint uVar34;
  int iVar35;
  RecurrentParameter *pRVar36;
  uint __uval;
  uint uVar37;
  int iVar38;
  unsigned_long uVar39;
  long in_stack_00000008;
  long in_stack_00000010;
  RepeatedPtrFieldBase *in_stack_00000018;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_00000028;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  *in_stack_00000030;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
  *in_stack_00000038;
  long __tmp;
  string __str;
  string hnamein;
  string __str_4;
  string cnamein;
  string cnameout;
  string hnameout;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  top;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  bottom;
  string __str_3;
  string __str_8;
  string __str_7;
  undefined1 local_7e8 [56];
  RepeatedPtrFieldBase *local_7b0;
  undefined1 local_7a8 [56];
  ulong local_770;
  Type *local_768;
  LogFinisher local_759;
  undefined1 local_758 [56];
  unsigned_long local_720;
  value_type local_718;
  undefined1 local_6f8 [16];
  int *local_6e8;
  _Alloc_hider _Stack_6e0;
  long local_6c0;
  undefined1 local_6b8 [16];
  char *local_6a8 [5];
  float local_67c;
  value_type local_678;
  value_type local_658;
  value_type local_638;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_618;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_5f8;
  int *local_5e0 [2];
  long local_5d0 [5];
  undefined1 local_5a8 [16];
  char *local_598 [5];
  undefined1 local_570 [56];
  int *local_538 [2];
  long local_528 [5];
  undefined1 local_500 [56];
  LogMessage local_4c8;
  LogMessage local_490;
  LogMessage local_458;
  LogMessage local_420;
  LogMessage local_3e8;
  LogMessage local_3b0;
  LogMessage local_378;
  LogMessage local_340;
  LogMessage local_308;
  LogMessage local_2d0;
  LogMessage local_298;
  LogMessage local_260;
  LogMessage local_228;
  LogMessage local_1f0;
  LogMessage local_1b8;
  LogMessage local_180;
  LogMessage local_148;
  LogMessage local_110;
  LogMessage local_d8;
  LogMessage local_a0;
  LogMessage local_68;
  
  uVar34 = *(uint *)__tmp;
  pTVar12 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000008 + 0x70),uVar34);
  iVar11 = getLayerIndex(pTVar12,in_stack_00000030);
  pTVar13 = google::protobuf::internal::RepeatedPtrFieldBase::
            Get<google::protobuf::RepeatedPtrField<caffe::LayerParameter>::TypeHandler>
                      ((RepeatedPtrFieldBase *)(in_stack_00000010 + 0x70),iVar11);
  this_00 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer>::TypeHandler>
                      (in_stack_00000018,(Type *)0x0);
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_5f8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((pTVar12->bottom_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_2d0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_2d0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_2d0);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5f8,
              (value_type *)((pTVar12->bottom_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  local_7b0 = in_stack_00000018;
  uVar37 = -uVar34;
  if (0 < (int)uVar34) {
    uVar37 = uVar34;
  }
  uVar33 = 1;
  if (9 < uVar37) {
    uVar28 = (ulong)uVar37;
    uVar31 = 4;
    do {
      uVar33 = uVar31;
      uVar23 = (uint)uVar28;
      if (uVar23 < 100) {
        uVar33 = uVar33 - 2;
        goto LAB_003ebf99;
      }
      if (uVar23 < 1000) {
        uVar33 = uVar33 - 1;
        goto LAB_003ebf99;
      }
      if (uVar23 < 10000) goto LAB_003ebf99;
      uVar28 = uVar28 / 10000;
      uVar31 = uVar33 + 4;
    } while (99999 < uVar23);
    uVar33 = uVar33 + 1;
  }
LAB_003ebf99:
  uVar31 = uVar34 >> 0x1f;
  cVar10 = (char)((int)uVar34 >> 0x1f);
  local_7a8._0_8_ = local_7a8 + 0x10;
  local_768 = pTVar12;
  std::__cxx11::string::_M_construct((ulong)local_7a8,(char)uVar33 - cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_7a8._0_8_ + (ulong)uVar31),uVar33,uVar37);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_7a8,0,(char *)0x0,0x5ff2b4);
  psVar24 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar24) {
    local_7e8._16_8_ = *psVar24;
    local_7e8._24_8_ = plVar15[3];
    local_7e8._0_8_ = local_7e8 + 0x10;
  }
  else {
    local_7e8._16_8_ = *psVar24;
    local_7e8._0_8_ = (size_type *)*plVar15;
  }
  local_7e8._8_8_ = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_7e8);
  local_718._M_dataplus._M_p = (pointer)&local_718.field_2;
  psVar24 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_718.field_2._M_allocated_capacity = *psVar24;
    local_718.field_2._8_8_ = plVar15[3];
  }
  else {
    local_718.field_2._M_allocated_capacity = *psVar24;
    local_718._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_718._M_string_length = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
    operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5f8,&local_718);
  uVar34 = 1;
  if (9 < uVar37) {
    uVar28 = (ulong)uVar37;
    uVar33 = 4;
    do {
      uVar34 = uVar33;
      uVar23 = (uint)uVar28;
      if (uVar23 < 100) {
        uVar34 = uVar34 - 2;
        goto LAB_003ec139;
      }
      if (uVar23 < 1000) {
        uVar34 = uVar34 - 1;
        goto LAB_003ec139;
      }
      if (uVar23 < 10000) goto LAB_003ec139;
      uVar28 = uVar28 / 10000;
      uVar33 = uVar34 + 4;
    } while (99999 < uVar23);
    uVar34 = uVar34 + 1;
  }
LAB_003ec139:
  local_7a8._0_8_ = local_7a8 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_7a8,(char)uVar34 - cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_7a8._0_8_ + (ulong)uVar31),uVar34,uVar37);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_7a8,0,(char *)0x0,0x5ff2b4);
  local_7e8._0_8_ = local_7e8 + 0x10;
  psVar24 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar24) {
    local_7e8._16_8_ = *psVar24;
    local_7e8._24_8_ = plVar15[3];
  }
  else {
    local_7e8._16_8_ = *psVar24;
    local_7e8._0_8_ = (size_type *)*plVar15;
  }
  local_7e8._8_8_ = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_7e8);
  local_678._M_dataplus._M_p = (pointer)&local_678.field_2;
  psVar24 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_678.field_2._M_allocated_capacity = *psVar24;
    local_678.field_2._8_8_ = plVar15[3];
  }
  else {
    local_678.field_2._M_allocated_capacity = *psVar24;
    local_678._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_678._M_string_length = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
    operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_5f8,&local_678);
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_618.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if ((local_768->top_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_298,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_298,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_298);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_618,
              (value_type *)((local_768->top_).super_RepeatedPtrFieldBase.rep_)->elements[0]);
  uVar34 = 1;
  if (9 < uVar37) {
    uVar28 = (ulong)uVar37;
    uVar33 = 4;
    do {
      uVar34 = uVar33;
      uVar23 = (uint)uVar28;
      if (uVar23 < 100) {
        uVar34 = uVar34 - 2;
        goto LAB_003ec361;
      }
      if (uVar23 < 1000) {
        uVar34 = uVar34 - 1;
        goto LAB_003ec361;
      }
      if (uVar23 < 10000) goto LAB_003ec361;
      uVar28 = uVar28 / 10000;
      uVar33 = uVar34 + 4;
    } while (99999 < uVar23);
    uVar34 = uVar34 + 1;
  }
LAB_003ec361:
  local_7a8._0_8_ = local_7a8 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_7a8,(char)uVar34 - cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_7a8._0_8_ + (ulong)uVar31),uVar34,uVar37);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_7a8,0,(char *)0x0,0x5ff2b4);
  psVar24 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar24) {
    local_7e8._16_8_ = *psVar24;
    local_7e8._24_8_ = plVar15[3];
    local_7e8._0_8_ = local_7e8 + 0x10;
  }
  else {
    local_7e8._16_8_ = *psVar24;
    local_7e8._0_8_ = (size_type *)*plVar15;
  }
  local_7e8._8_8_ = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_7e8);
  local_638._M_dataplus._M_p = (pointer)&local_638.field_2;
  psVar24 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_638.field_2._M_allocated_capacity = *psVar24;
    local_638.field_2._8_8_ = plVar15[3];
  }
  else {
    local_638.field_2._M_allocated_capacity = *psVar24;
    local_638._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_638._M_string_length = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
    operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_618,&local_638);
  uVar34 = 1;
  if (9 < uVar37) {
    uVar28 = (ulong)uVar37;
    uVar33 = 4;
    do {
      uVar34 = uVar33;
      uVar23 = (uint)uVar28;
      if (uVar23 < 100) {
        uVar34 = uVar34 - 2;
        goto LAB_003ec4f3;
      }
      if (uVar23 < 1000) {
        uVar34 = uVar34 - 1;
        goto LAB_003ec4f3;
      }
      if (uVar23 < 10000) goto LAB_003ec4f3;
      uVar28 = uVar28 / 10000;
      uVar33 = uVar34 + 4;
    } while (99999 < uVar23);
    uVar34 = uVar34 + 1;
  }
LAB_003ec4f3:
  local_7a8._0_8_ = local_7a8 + 0x10;
  std::__cxx11::string::_M_construct((ulong)local_7a8,(char)uVar34 - cVar10);
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)(local_7a8._0_8_ + (ulong)uVar31),uVar34,uVar37);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_7a8,0,(char *)0x0,0x5ff2b4);
  pTVar12 = local_768;
  psVar24 = (size_type *)(plVar15 + 2);
  if ((size_type *)*plVar15 == psVar24) {
    local_7e8._16_8_ = *psVar24;
    local_7e8._24_8_ = plVar15[3];
    local_7e8._0_8_ = local_7e8 + 0x10;
  }
  else {
    local_7e8._16_8_ = *psVar24;
    local_7e8._0_8_ = (size_type *)*plVar15;
  }
  local_7e8._8_8_ = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_7e8);
  local_658._M_dataplus._M_p = (pointer)&local_658.field_2;
  psVar24 = (size_type *)(plVar15 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar24) {
    local_658.field_2._M_allocated_capacity = *psVar24;
    local_658.field_2._8_8_ = plVar15[3];
  }
  else {
    local_658.field_2._M_allocated_capacity = *psVar24;
    local_658._M_dataplus._M_p = (pointer)*plVar15;
  }
  local_658._M_string_length = plVar15[1];
  *plVar15 = (long)psVar24;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
    operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&local_618,&local_658);
  convertCaffeMetadata
            ((pTVar12->name_).ptr_,&local_5f8,&local_618,
             (RepeatedPtrField<CoreML::Specification::NeuralNetworkLayer> *)local_7b0,
             in_stack_00000028);
  pRVar36 = pTVar12->recurrent_param_;
  if (pRVar36 == (RecurrentParameter *)0x0) {
    pRVar36 = (RecurrentParameter *)&caffe::_RecurrentParameter_default_instance_;
  }
  uVar34 = pRVar36->num_output_;
  local_7e8._0_8_ = (pointer)0x0;
  local_7e8._8_8_ = (char *)0x0;
  local_7e8._16_8_ = 0;
  local_7e8._0_8_ = operator_new(8);
  local_7e8._8_8_ = local_7e8._0_8_ + 8;
  *(ulong *)local_7e8._0_8_ = (ulong)uVar34;
  local_7e8._16_8_ = local_7e8._8_8_;
  local_7b0 = (RepeatedPtrFieldBase *)(ulong)uVar34;
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
            ::operator[](in_stack_00000038,&local_718);
  std::vector<long,_std::allocator<long>_>::_M_move_assign(pmVar16,local_7e8);
  if ((ulong *)local_7e8._0_8_ != (ulong *)0x0) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ - local_7e8._0_8_);
  }
  local_7e8._0_8_ = (pointer)0x0;
  local_7e8._8_8_ = (char *)0x0;
  local_7e8._16_8_ = 0;
  local_7e8._0_8_ = operator_new(8);
  local_7e8._8_8_ = local_7e8._0_8_ + 8;
  *(RepeatedPtrFieldBase **)local_7e8._0_8_ = local_7b0;
  local_7e8._16_8_ = local_7e8._8_8_;
  pmVar16 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<long,_std::allocator<long>_>_>_>_>
            ::operator[](in_stack_00000038,&local_678);
  std::vector<long,_std::allocator<long>_>::_M_move_assign(pmVar16);
  if ((ulong *)local_7e8._0_8_ != (ulong *)0x0) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ - local_7e8._0_8_);
  }
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ == 0) {
    local_7e8._0_8_ = local_7e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7e8,"Weights not found in the caffemodel file","");
    psVar3 = (local_768->name_).ptr_;
    local_7a8._0_8_ = local_7a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Recurrent","");
    errorInCaffeProto((string *)local_7e8,psVar3,(string *)local_7a8);
    if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
      operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
  }
  if (local_7b0 == (RepeatedPtrFieldBase *)0x0) {
    local_7e8._0_8_ = local_7e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_7e8,"\'num_output\' cannot be non-positive","");
    psVar3 = (local_768->name_).ptr_;
    local_7a8._0_8_ = local_7a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Recurrent","");
    errorInCaffeProto((string *)local_7e8,psVar3,(string *)local_7a8);
    if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
      operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
  }
  pTVar12 = local_768;
  if (pRVar36->expose_hidden_ == true) {
    local_7e8._0_8_ = local_7e8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7e8,"expose_hidden","");
    psVar3 = (pTVar12->name_).ptr_;
    local_7a8._0_8_ = local_7a8 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_7a8,"Recurrent","");
    local_758._0_8_ = local_758 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_758,"True","");
    unsupportedCaffeParrameterWithOption
              ((string *)local_7e8,psVar3,(string *)local_7a8,(string *)local_758);
    if ((undefined1 *)local_758._0_8_ != local_758 + 0x10) {
      operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
    }
    if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
      operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
  }
  if (this_00->_oneof_case_[0] != 0x1a4) {
    CoreML::Specification::NeuralNetworkLayer::clear_layer(this_00);
    this_00->_oneof_case_[0] = 0x1a4;
    this_01 = (UniDirectionalLSTMLayerParams *)operator_new(0x50);
    CoreML::Specification::UniDirectionalLSTMLayerParams::UniDirectionalLSTMLayerParams(this_01);
    (this_00->layer_).unidirectionallstm_ = this_01;
  }
  pCVar4 = (this_00->layer_).convolution_;
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_260,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_260,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_260);
  }
  puVar30 = *(undefined8 **)
             ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x78);
  if (puVar30 == (undefined8 *)0x0) {
    puVar30 = &caffe::_BlobShape_default_instance_;
  }
  if (*(int *)(puVar30 + 3) < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_228,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x476);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_228,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_228);
  }
  lVar5 = *(long *)(puVar30[4] + 0x10);
  *(RepeatedPtrFieldBase **)&pCVar4->dilationfactor_ = local_7b0;
  if (lVar5 < 0) {
    __assert_fail("input_size >= 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/caffeconverter/Caffe/LSTM.cpp"
                  ,0x4d,
                  "void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters)")
    ;
  }
  *(long *)&pCVar4->_stride_cached_byte_size_ = lVar5;
  lVar6._0_4_ = (pCVar4->stride_).current_size_;
  lVar6._4_4_ = (pCVar4->stride_).total_size_;
  if (lVar6 == 0) {
    pLVar17 = (LSTMParams *)operator_new(0x20);
    CoreML::Specification::LSTMParams::LSTMParams(pLVar17);
    *(LSTMParams **)&pCVar4->stride_ = pLVar17;
  }
  lVar6 = *(long *)&pCVar4->stride_;
  *(undefined1 *)(lVar6 + 0x14) = 0;
  if (lVar6 == 0) {
    pLVar17 = (LSTMParams *)operator_new(0x20);
    CoreML::Specification::LSTMParams::LSTMParams(pLVar17);
    *(LSTMParams **)&pCVar4->stride_ = pLVar17;
  }
  lVar6 = *(long *)&pCVar4->stride_;
  *(undefined1 *)(lVar6 + 0x16) = 0;
  if (lVar6 == 0) {
    pLVar17 = (LSTMParams *)operator_new(0x20);
    CoreML::Specification::LSTMParams::LSTMParams(pLVar17);
    *(LSTMParams **)&pCVar4->stride_ = pLVar17;
  }
  *(undefined1 *)(*(long *)&pCVar4->stride_ + 0x15) = 1;
  this = &pCVar4->kernelsize_;
  pTVar18 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this,(Type *)0x0);
  if (pTVar18->_oneof_case_[0] != 0x28) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pTVar18);
    pTVar18->_oneof_case_[0] = 0x28;
    this_02 = (ActivationSigmoid *)operator_new(0x18);
    CoreML::Specification::ActivationSigmoid::ActivationSigmoid(this_02);
    (pTVar18->NonlinearityType_).sigmoid_ = this_02;
  }
  pTVar18 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this,(Type *)0x0);
  if (pTVar18->_oneof_case_[0] != 0x1e) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pTVar18);
    pTVar18->_oneof_case_[0] = 0x1e;
    pAVar19 = (ActivationTanh *)operator_new(0x18);
    CoreML::Specification::ActivationTanh::ActivationTanh(pAVar19);
    (pTVar18->NonlinearityType_).tanh_ = pAVar19;
  }
  pTVar18 = google::protobuf::internal::RepeatedPtrFieldBase::
            Add<google::protobuf::RepeatedPtrField<CoreML::Specification::ActivationParams>::TypeHandler>
                      ((RepeatedPtrFieldBase *)this,(Type *)0x0);
  if (pTVar18->_oneof_case_[0] != 0x1e) {
    CoreML::Specification::ActivationParams::clear_NonlinearityType(pTVar18);
    pTVar18->_oneof_case_[0] = 0x1e;
    pAVar19 = (ActivationTanh *)operator_new(0x18);
    CoreML::Specification::ActivationTanh::ActivationTanh(pAVar19);
    (pTVar18->NonlinearityType_).tanh_ = pAVar19;
  }
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1f0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_1f0,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1f0);
  }
  uVar34 = *(uint *)((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] + 0x18);
  local_770 = (ulong)uVar34;
  local_720 = (long)local_7b0 * 4;
  uVar28 = lVar5 * local_720;
  if (uVar28 - (long)(int)uVar34 != 0) {
    uVar34 = 1;
    if (9 < uVar28) {
      uVar29 = uVar28;
      uVar37 = 4;
      do {
        uVar34 = uVar37;
        if (uVar29 < 100) {
          uVar34 = uVar34 - 2;
          goto LAB_003ecd13;
        }
        if (uVar29 < 1000) {
          uVar34 = uVar34 - 1;
          goto LAB_003ecd13;
        }
        if (uVar29 < 10000) goto LAB_003ecd13;
        bVar9 = 99999 < uVar29;
        uVar29 = uVar29 / 10000;
        uVar37 = uVar34 + 4;
      } while (bVar9);
      uVar34 = uVar34 + 1;
    }
LAB_003ecd13:
    local_5e0[0] = &((LogMessage *)local_5e0)->line_;
    std::__cxx11::string::_M_construct((ulong)local_5e0,(char)uVar34);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_5e0[0],uVar34,uVar28);
    plVar15 = (long *)std::__cxx11::string::replace((ulong)local_5e0,0,(char *)0x0,0x5fe537);
    uVar28 = local_770;
    local_6f8._0_8_ = &local_6e8;
    ppiVar25 = (int **)(plVar15 + 2);
    if ((int **)*plVar15 == ppiVar25) {
      local_6e8 = *ppiVar25;
      _Stack_6e0._M_p = (pointer)plVar15[3];
    }
    else {
      local_6e8 = *ppiVar25;
      local_6f8._0_8_ = (int **)*plVar15;
    }
    local_6f8._8_8_ = plVar15[1];
    *plVar15 = (long)ppiVar25;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append(local_6f8);
    puVar2 = (ulong *)(local_758 + 0x10);
    puVar26 = (ulong *)(plVar15 + 2);
    if ((ulong *)*plVar15 == puVar26) {
      local_758._16_8_ = *puVar26;
      local_758._24_8_ = plVar15[3];
      local_758._0_8_ = puVar2;
    }
    else {
      local_758._16_8_ = *puVar26;
      local_758._0_8_ = (ulong *)*plVar15;
    }
    local_758._8_8_ = plVar15[1];
    *plVar15 = (long)puVar26;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    uVar37 = (uint)uVar28;
    uVar34 = -uVar37;
    if (0 < (int)uVar37) {
      uVar34 = uVar37;
    }
    uVar37 = 1;
    if (9 < uVar34) {
      uVar29 = (ulong)uVar34;
      uVar33 = 4;
      do {
        uVar37 = uVar33;
        uVar31 = (uint)uVar29;
        if (uVar31 < 100) {
          uVar37 = uVar37 - 2;
          goto LAB_003ece7e;
        }
        if (uVar31 < 1000) {
          uVar37 = uVar37 - 1;
          goto LAB_003ece7e;
        }
        if (uVar31 < 10000) goto LAB_003ece7e;
        uVar29 = uVar29 / 10000;
        uVar33 = uVar37 + 4;
      } while (99999 < uVar31);
      uVar37 = uVar37 + 1;
    }
LAB_003ece7e:
    uVar28 = uVar28 >> 0x1f & 1;
    local_6b8._0_8_ = local_6a8;
    std::__cxx11::string::_M_construct((ulong)local_6b8,(char)uVar37 + (char)uVar28);
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)(uVar28 + local_6b8._0_8_),uVar37,uVar34);
    pcVar32 = (char *)0xf;
    if ((ulong *)local_758._0_8_ != puVar2) {
      pcVar32 = (char *)local_758._16_8_;
    }
    if (pcVar32 < (char *)(local_6b8._8_8_ + local_758._8_8_)) {
      pcVar32 = (char *)0xf;
      if ((char **)local_6b8._0_8_ != local_6a8) {
        pcVar32 = local_6a8[0];
      }
      if (pcVar32 < (char *)(local_6b8._8_8_ + local_758._8_8_)) goto LAB_003ecf0c;
      puVar30 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_6b8,0,(char *)0x0,local_758._0_8_);
    }
    else {
LAB_003ecf0c:
      puVar30 = (undefined8 *)std::__cxx11::string::_M_append(local_758,local_6b8._0_8_);
    }
    local_7a8._0_8_ = local_7a8 + 0x10;
    psVar24 = puVar30 + 2;
    if ((size_type *)*puVar30 == psVar24) {
      local_7a8._16_8_ = *psVar24;
      local_7a8._24_8_ = puVar30[3];
    }
    else {
      local_7a8._16_8_ = *psVar24;
      local_7a8._0_8_ = (size_type *)*puVar30;
    }
    local_7a8._8_8_ = puVar30[1];
    *puVar30 = psVar24;
    puVar30[1] = 0;
    *(undefined1 *)psVar24 = 0;
    plVar15 = (long *)std::__cxx11::string::append(local_7a8);
    local_7e8._0_8_ = local_7e8 + 0x10;
    puVar26 = (ulong *)(plVar15 + 2);
    if ((ulong *)*plVar15 == puVar26) {
      local_7e8._16_8_ = *puVar26;
      local_7e8._24_8_ = plVar15[3];
    }
    else {
      local_7e8._16_8_ = *puVar26;
      local_7e8._0_8_ = (ulong *)*plVar15;
    }
    local_7e8._8_8_ = plVar15[1];
    *plVar15 = (long)puVar26;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    psVar3 = (local_768->name_).ptr_;
    local_570._0_8_ = local_570 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"Recurrent","");
    errorInCaffeProto((string *)local_7e8,psVar3,(string *)local_570);
    if ((undefined1 *)local_570._0_8_ != local_570 + 0x10) {
      operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
    }
    uVar34 = (uint)local_770;
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
    if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
      operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
    }
    if ((char **)local_6b8._0_8_ != local_6a8) {
      operator_delete((void *)local_6b8._0_8_,(ulong)(local_6a8[0] + 1));
    }
    if ((ulong *)local_758._0_8_ != puVar2) {
      operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
    }
    if ((int **)local_6f8._0_8_ != &local_6e8) {
      operator_delete((void *)local_6f8._0_8_,(long)local_6e8 + 1);
    }
    if (local_5e0[0] != &((LogMessage *)local_5e0)->line_) {
      operator_delete(local_5e0[0],local_5d0[0] + 1);
    }
  }
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[1].arena == (Arena *)0x0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[1].arena = (Arena *)pWVar21;
  }
  pAVar8 = pRVar7[1].arena;
  uVar37 = uVar34 + 3;
  if (-1 < (int)uVar34) {
    uVar37 = uVar34;
  }
  local_6c0 = lVar5;
  if ((int)uVar34 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_4c8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_4c8,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_4c8);
  }
  pRVar1 = (RepeatedField<float> *)(pAVar8 + 0x10);
  iVar11 = (int)uVar37 >> 2;
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(pAVar8 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar34) {
    iVar38 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_180,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_180,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_180);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)local_7e8);
      iVar38 = iVar38 + 1;
    } while (iVar11 != iVar38);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[1].elements[0] == 0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[1].elements[0] = (unsigned_long)pWVar21;
  }
  uVar39 = pRVar7[1].elements[0];
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_490,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_490,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_490);
  }
  pRVar1 = (RepeatedField<float> *)(uVar39 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(uVar39 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_6c0 * (uint)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_148,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_148,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_148);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38 + iVar35);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,(float *)local_7e8);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[2].elements[0] == 0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[2].elements[0] = (unsigned_long)pWVar21;
  }
  uVar39 = pRVar7[2].elements[0];
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_458,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_458,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_458);
  }
  pRVar1 = (RepeatedField<float> *)(uVar39 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(uVar39 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_6c0 * (uint)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_110,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_110,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_110);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38 * 2 + iVar35);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,(float *)local_7e8);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[2].arena == (Arena *)0x0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[2].arena = (Arena *)pWVar21;
  }
  pAVar8 = pRVar7[2].arena;
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_420,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_420,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_420);
  }
  pRVar1 = (RepeatedField<float> *)(pAVar8 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(pAVar8 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_6c0 * (uint)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 1) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_d8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_d8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_d8);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_)->elements[0] +
                           0x18),iVar38 * 3 + iVar35);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,(float *)local_7e8);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  uVar39 = local_720;
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_1b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    uVar39 = local_720;
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_1b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_1b8);
  }
  uVar34 = *(uint *)(*(long *)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18);
  local_770 = (ulong)uVar34;
  if (uVar39 != (long)(int)uVar34) {
    uVar37 = 1;
    if (2 < (uint)local_7b0) {
      uVar27 = uVar39;
      uVar33 = 4;
      do {
        uVar37 = uVar33;
        if (uVar27 < 100) {
          uVar37 = uVar37 - 2;
          goto LAB_003ed86f;
        }
        if (uVar27 < 1000) {
          uVar37 = uVar37 - 1;
          goto LAB_003ed86f;
        }
        if (uVar27 < 10000) goto LAB_003ed86f;
        bVar9 = 99999 < uVar27;
        uVar27 = uVar27 / 10000;
        uVar33 = uVar37 + 4;
      } while (bVar9);
      uVar37 = uVar37 + 1;
    }
LAB_003ed86f:
    local_5e0[0] = &((LogMessage *)local_5e0)->line_;
    std::__cxx11::string::_M_construct((ulong)local_5e0,(char)uVar37);
    std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_5e0[0],uVar37,uVar39);
    plVar15 = (long *)std::__cxx11::string::replace((ulong)local_5e0,0,(char *)0x0,0x5fe537);
    local_6f8._0_8_ = &local_6e8;
    ppiVar25 = (int **)(plVar15 + 2);
    if ((int **)*plVar15 == ppiVar25) {
      local_6e8 = *ppiVar25;
      _Stack_6e0._M_p = (pointer)plVar15[3];
    }
    else {
      local_6e8 = *ppiVar25;
      local_6f8._0_8_ = (int **)*plVar15;
    }
    local_6f8._8_8_ = plVar15[1];
    *plVar15 = (long)ppiVar25;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    plVar15 = (long *)std::__cxx11::string::append(local_6f8);
    puVar2 = (ulong *)(local_758 + 0x10);
    puVar26 = (ulong *)(plVar15 + 2);
    if ((ulong *)*plVar15 == puVar26) {
      local_758._16_8_ = *puVar26;
      local_758._24_8_ = plVar15[3];
      local_758._0_8_ = puVar2;
    }
    else {
      local_758._16_8_ = *puVar26;
      local_758._0_8_ = (ulong *)*plVar15;
    }
    local_758._8_8_ = plVar15[1];
    *plVar15 = (long)puVar26;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    uVar37 = -uVar34;
    if (0 < (int)uVar34) {
      uVar37 = uVar34;
    }
    uVar33 = 1;
    if (9 < uVar37) {
      uVar28 = (ulong)uVar37;
      uVar31 = 4;
      do {
        uVar33 = uVar31;
        uVar23 = (uint)uVar28;
        if (uVar23 < 100) {
          uVar33 = uVar33 - 2;
          goto LAB_003ed9cf;
        }
        if (uVar23 < 1000) {
          uVar33 = uVar33 - 1;
          goto LAB_003ed9cf;
        }
        if (uVar23 < 10000) goto LAB_003ed9cf;
        uVar28 = uVar28 / 10000;
        uVar31 = uVar33 + 4;
      } while (99999 < uVar23);
      uVar33 = uVar33 + 1;
    }
LAB_003ed9cf:
    local_6b8._0_8_ = local_6a8;
    std::__cxx11::string::_M_construct((ulong)local_6b8,(char)uVar33 - (char)((int)uVar34 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              ((char *)((ulong)(uVar34 >> 0x1f) + local_6b8._0_8_),uVar33,uVar37);
    pcVar32 = (char *)0xf;
    if ((ulong *)local_758._0_8_ != puVar2) {
      pcVar32 = (char *)local_758._16_8_;
    }
    if (pcVar32 < (char *)(local_6b8._8_8_ + local_758._8_8_)) {
      pcVar32 = (char *)0xf;
      if ((char **)local_6b8._0_8_ != local_6a8) {
        pcVar32 = local_6a8[0];
      }
      if (pcVar32 < (char *)(local_6b8._8_8_ + local_758._8_8_)) goto LAB_003eda5c;
      puVar30 = (undefined8 *)
                std::__cxx11::string::replace((ulong)local_6b8,0,(char *)0x0,local_758._0_8_);
    }
    else {
LAB_003eda5c:
      puVar30 = (undefined8 *)std::__cxx11::string::_M_append(local_758,local_6b8._0_8_);
    }
    local_7a8._0_8_ = local_7a8 + 0x10;
    psVar24 = puVar30 + 2;
    if ((size_type *)*puVar30 == psVar24) {
      local_7a8._16_8_ = *psVar24;
      local_7a8._24_8_ = puVar30[3];
    }
    else {
      local_7a8._16_8_ = *psVar24;
      local_7a8._0_8_ = (size_type *)*puVar30;
    }
    local_7a8._8_8_ = puVar30[1];
    *puVar30 = psVar24;
    puVar30[1] = 0;
    *(undefined1 *)psVar24 = 0;
    plVar15 = (long *)std::__cxx11::string::append(local_7a8);
    local_7e8._0_8_ = local_7e8 + 0x10;
    puVar26 = (ulong *)(plVar15 + 2);
    if ((ulong *)*plVar15 == puVar26) {
      local_7e8._16_8_ = *puVar26;
      local_7e8._24_8_ = plVar15[3];
    }
    else {
      local_7e8._16_8_ = *puVar26;
      local_7e8._0_8_ = (ulong *)*plVar15;
    }
    local_7e8._8_8_ = plVar15[1];
    *plVar15 = (long)puVar26;
    plVar15[1] = 0;
    *(undefined1 *)(plVar15 + 2) = 0;
    psVar3 = (local_768->name_).ptr_;
    local_570._0_8_ = local_570 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_570,"Recurrent","");
    errorInCaffeProto((string *)local_7e8,psVar3,(string *)local_570);
    if ((undefined1 *)local_570._0_8_ != local_570 + 0x10) {
      operator_delete((void *)local_570._0_8_,local_570._16_8_ + 1);
    }
    if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
      operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
    }
    if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
      operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
    }
    if ((char **)local_6b8._0_8_ != local_6a8) {
      operator_delete((void *)local_6b8._0_8_,(ulong)(local_6a8[0] + 1));
    }
    uVar34 = (uint)local_770;
    if ((ulong *)local_758._0_8_ != puVar2) {
      operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
    }
    if ((int **)local_6f8._0_8_ != &local_6e8) {
      operator_delete((void *)local_6f8._0_8_,(long)local_6e8 + 1);
    }
    if (local_5e0[0] != &((LogMessage *)local_5e0)->line_) {
      operator_delete(local_5e0[0],local_5d0[0] + 1);
    }
  }
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[5].arena == (Arena *)0x0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[5].arena = (Arena *)pWVar21;
  }
  pAVar8 = pRVar7[5].arena;
  uVar37 = uVar34 + 3;
  if (-1 < (int)uVar34) {
    uVar37 = uVar34;
  }
  if ((int)uVar34 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_3e8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_3e8,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_3e8);
  }
  pRVar1 = (RepeatedField<float> *)(pAVar8 + 0x10);
  iVar11 = (int)uVar37 >> 2;
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(pAVar8 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar34) {
    iVar38 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_a0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_a0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_a0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,iVar38);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)local_7e8);
      iVar38 = iVar38 + 1;
    } while (iVar11 != iVar38);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[5].elements[0] == 0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[5].elements[0] = (unsigned_long)pWVar21;
  }
  uVar39 = pRVar7[5].elements[0];
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_3b0,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_3b0,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_3b0);
  }
  pRVar1 = (RepeatedField<float> *)(uVar39 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(uVar39 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  (&local_68,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            (&local_68,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage(&local_68);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,(int)local_7b0 + iVar38);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)local_7e8);
      iVar38 = iVar38 + 1;
    } while (iVar11 != iVar38);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[6].elements[0] == 0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[6].elements[0] = (unsigned_long)pWVar21;
  }
  uVar39 = pRVar7[6].elements[0];
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_378,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_378,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_378);
  }
  pRVar1 = (RepeatedField<float> *)(uVar39 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(uVar39 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_570,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_570,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_570);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,iVar38 * 2 + iVar35);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,(float *)local_7e8);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[6].arena == (Arena *)0x0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[6].arena = (Arena *)pWVar21;
  }
  pAVar8 = pRVar7[6].arena;
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_340,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_340,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_340);
  }
  pRVar1 = (RepeatedField<float> *)(pAVar8 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(pAVar8 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 2) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_5e0,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_5e0,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_5e0);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           (*(long *)((pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_ + 1) + 0x18)
                           ,iVar38 * 3 + iVar35);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,(float *)local_7e8);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  uVar39 = local_720;
  if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_6b8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x5ca);
    uVar39 = local_720;
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_6b8,"CHECK failed: (index) < (current_size_): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_6b8);
  }
  uVar34 = *(uint *)((long)(pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] + 0x18);
  local_770 = (ulong)uVar34;
  uVar28 = uVar39 * (long)local_7b0;
  if (uVar28 - (long)(int)uVar34 == 0) goto LAB_003ee783;
  uVar37 = 1;
  if (9 < uVar28) {
    uVar29 = uVar28;
    uVar33 = 4;
    do {
      uVar37 = uVar33;
      if (uVar29 < 100) {
        uVar37 = uVar37 - 2;
        goto LAB_003ee3a5;
      }
      if (uVar29 < 1000) {
        uVar37 = uVar37 - 1;
        goto LAB_003ee3a5;
      }
      if (uVar29 < 10000) goto LAB_003ee3a5;
      bVar9 = 99999 < uVar29;
      uVar29 = uVar29 / 10000;
      uVar33 = uVar37 + 4;
    } while (bVar9);
    uVar37 = uVar37 + 1;
  }
LAB_003ee3a5:
  local_538[0] = &((LogMessage *)local_538)->line_;
  std::__cxx11::string::_M_construct((ulong)local_538,(char)uVar37);
  std::__detail::__to_chars_10_impl<unsigned_long>((char *)local_538[0],uVar37,uVar28);
  plVar15 = (long *)std::__cxx11::string::replace((ulong)local_538,0,(char *)0x0,0x5fe537);
  ppiVar25 = (int **)(plVar15 + 2);
  if ((int **)*plVar15 == ppiVar25) {
    local_6e8 = *ppiVar25;
    _Stack_6e0._M_p = (pointer)plVar15[3];
    local_6f8._0_8_ = &local_6e8;
  }
  else {
    local_6e8 = *ppiVar25;
    local_6f8._0_8_ = (int **)*plVar15;
  }
  local_6f8._8_8_ = plVar15[1];
  *plVar15 = (long)ppiVar25;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_6f8);
  puVar2 = (ulong *)(local_758 + 0x10);
  puVar26 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar26) {
    local_758._16_8_ = *puVar26;
    local_758._24_8_ = plVar15[3];
    local_758._0_8_ = puVar2;
  }
  else {
    local_758._16_8_ = *puVar26;
    local_758._0_8_ = (ulong *)*plVar15;
  }
  local_758._8_8_ = plVar15[1];
  *plVar15 = (long)puVar26;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  uVar37 = -uVar34;
  if (0 < (int)uVar34) {
    uVar37 = uVar34;
  }
  uVar33 = 1;
  if (9 < uVar37) {
    uVar28 = (ulong)uVar37;
    uVar31 = 4;
    do {
      uVar33 = uVar31;
      uVar23 = (uint)uVar28;
      if (uVar23 < 100) {
        uVar33 = uVar33 - 2;
        goto LAB_003ee50b;
      }
      if (uVar23 < 1000) {
        uVar33 = uVar33 - 1;
        goto LAB_003ee50b;
      }
      if (uVar23 < 10000) goto LAB_003ee50b;
      uVar28 = uVar28 / 10000;
      uVar31 = uVar33 + 4;
    } while (99999 < uVar23);
    uVar33 = uVar33 + 1;
  }
LAB_003ee50b:
  local_5a8._0_8_ = local_598;
  std::__cxx11::string::_M_construct((ulong)local_5a8,(char)uVar33 - (char)((int)uVar34 >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            ((char *)((ulong)(uVar34 >> 0x1f) + local_5a8._0_8_),uVar33,uVar37);
  pcVar32 = (char *)0xf;
  if ((ulong *)local_758._0_8_ != puVar2) {
    pcVar32 = (char *)local_758._16_8_;
  }
  if (pcVar32 < (char *)(local_5a8._8_8_ + local_758._8_8_)) {
    pcVar32 = (char *)0xf;
    if ((char **)local_5a8._0_8_ != local_598) {
      pcVar32 = local_598[0];
    }
    if (pcVar32 < (char *)(local_5a8._8_8_ + local_758._8_8_)) goto LAB_003ee598;
    puVar30 = (undefined8 *)
              std::__cxx11::string::replace((ulong)local_5a8,0,(char *)0x0,local_758._0_8_);
  }
  else {
LAB_003ee598:
    puVar30 = (undefined8 *)std::__cxx11::string::_M_append(local_758,local_5a8._0_8_);
  }
  local_7a8._0_8_ = local_7a8 + 0x10;
  psVar24 = puVar30 + 2;
  if ((size_type *)*puVar30 == psVar24) {
    local_7a8._16_8_ = *psVar24;
    local_7a8._24_8_ = puVar30[3];
  }
  else {
    local_7a8._16_8_ = *psVar24;
    local_7a8._0_8_ = (size_type *)*puVar30;
  }
  local_7a8._8_8_ = puVar30[1];
  *puVar30 = psVar24;
  puVar30[1] = 0;
  *(undefined1 *)psVar24 = 0;
  plVar15 = (long *)std::__cxx11::string::append(local_7a8);
  local_7e8._0_8_ = local_7e8 + 0x10;
  puVar26 = (ulong *)(plVar15 + 2);
  if ((ulong *)*plVar15 == puVar26) {
    local_7e8._16_8_ = *puVar26;
    local_7e8._24_8_ = plVar15[3];
  }
  else {
    local_7e8._16_8_ = *puVar26;
    local_7e8._0_8_ = (ulong *)*plVar15;
  }
  local_7e8._8_8_ = plVar15[1];
  *plVar15 = (long)puVar26;
  plVar15[1] = 0;
  *(undefined1 *)(plVar15 + 2) = 0;
  psVar3 = (local_768->name_).ptr_;
  local_500._0_8_ = local_500 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"Recurrent","");
  errorInCaffeProto((string *)local_7e8,psVar3,(string *)local_500);
  if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
    operator_delete((void *)local_500._0_8_,local_500._16_8_ + 1);
  }
  if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
    operator_delete((void *)local_7e8._0_8_,local_7e8._16_8_ + 1);
  }
  if ((undefined1 *)local_7a8._0_8_ != local_7a8 + 0x10) {
    operator_delete((void *)local_7a8._0_8_,local_7a8._16_8_ + 1);
  }
  if ((char **)local_5a8._0_8_ != local_598) {
    operator_delete((void *)local_5a8._0_8_,(ulong)(local_598[0] + 1));
  }
  uVar34 = (uint)local_770;
  if ((ulong *)local_758._0_8_ != puVar2) {
    operator_delete((void *)local_758._0_8_,local_758._16_8_ + 1);
  }
  if ((int **)local_6f8._0_8_ != &local_6e8) {
    operator_delete((void *)local_6f8._0_8_,(long)local_6e8 + 1);
  }
  if (local_538[0] != &((LogMessage *)local_538)->line_) {
    operator_delete(local_538[0],local_528[0] + 1);
  }
LAB_003ee783:
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[3].arena == (Arena *)0x0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[3].arena = (Arena *)pWVar21;
  }
  pAVar8 = pRVar7[3].arena;
  uVar37 = uVar34 + 3;
  if (-1 < (int)uVar34) {
    uVar37 = uVar34;
  }
  if ((int)uVar34 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              (&local_308,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        (&local_308,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage(&local_308);
  }
  pRVar1 = (RepeatedField<float> *)(pAVar8 + 0x10);
  iVar11 = (int)uVar37 >> 2;
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(pAVar8 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar34) {
    iVar38 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_6f8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_6f8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_6f8);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar38,(float *)local_7e8);
      iVar38 = iVar38 + 1;
    } while (iVar11 != iVar38);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[3].elements[0] == 0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[3].elements[0] = (unsigned_long)pWVar21;
  }
  uVar39 = pRVar7[3].elements[0];
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_500,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_500,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_500);
  }
  pRVar1 = (RepeatedField<float> *)(uVar39 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(uVar39 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_758,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_758,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7a8,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_758);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38 * iVar38 + iVar35);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,(float *)local_7e8);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[4].elements[0] == 0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[4].elements[0] = (unsigned_long)pWVar21;
  }
  uVar39 = pRVar7[4].elements[0];
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_5a8,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_5a8,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_5a8);
  }
  pRVar1 = (RepeatedField<float> *)(uVar39 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(uVar39 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_7a8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_7a8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_538,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_7a8);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38 * iVar38 * 2 + iVar35);
      local_7e8._0_4_ = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,(float *)local_7e8);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  uVar28 = local_770;
  if ((pCVar4->stride_).rep_ == (Rep *)0x0) {
    pLVar20 = (LSTMWeightParams *)operator_new(0x90);
    CoreML::Specification::LSTMWeightParams::LSTMWeightParams(pLVar20);
    (pCVar4->stride_).rep_ = (Rep *)pLVar20;
  }
  pRVar7 = (pCVar4->stride_).rep_;
  if (pRVar7[4].arena == (Arena *)0x0) {
    pWVar21 = (WeightParams *)operator_new(0x50);
    CoreML::Specification::WeightParams::WeightParams(pWVar21);
    pRVar7[4].arena = (Arena *)pWVar21;
  }
  pAVar8 = pRVar7[4].arena;
  if ((int)uVar28 < -3) {
    google::protobuf::internal::LogMessage::LogMessage
              ((LogMessage *)local_538,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
               ,0x46a);
    pLVar14 = google::protobuf::internal::LogMessage::operator<<
                        ((LogMessage *)local_538,"CHECK failed: (new_size) >= (0): ");
    google::protobuf::internal::LogFinisher::operator=((LogFinisher *)local_7e8,pLVar14);
    google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_538);
  }
  pRVar1 = (RepeatedField<float> *)(pAVar8 + 0x10);
  if (pRVar1->current_size_ < iVar11) {
    google::protobuf::RepeatedField<float>::Reserve(pRVar1,iVar11);
    iVar38 = pRVar1->current_size_;
    if (iVar38 != iVar11) {
      memset((void *)(*(long *)(pAVar8 + 0x18) + (long)iVar38 * 4 + 8),0,
             (long)iVar11 * 4 + (long)iVar38 * -4);
    }
  }
  pRVar1->current_size_ = iVar11;
  if (3 < (int)uVar28) {
    iVar38 = (int)local_7b0;
    iVar35 = 0;
    do {
      if ((pTVar13->blobs_).super_RepeatedPtrFieldBase.current_size_ < 3) {
        google::protobuf::internal::LogMessage::LogMessage
                  ((LogMessage *)local_7e8,LOGLEVEL_DFATAL,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/1duo[P]coremltools/deps/protobuf/src/google/protobuf/repeated_field.h"
                   ,0x5ca);
        pLVar14 = google::protobuf::internal::LogMessage::operator<<
                            ((LogMessage *)local_7e8,"CHECK failed: (index) < (current_size_): ");
        google::protobuf::internal::LogFinisher::operator=(&local_759,pLVar14);
        google::protobuf::internal::LogMessage::~LogMessage((LogMessage *)local_7e8);
      }
      pfVar22 = google::protobuf::RepeatedField<float>::Get
                          ((RepeatedField<float> *)
                           ((long)(pTVar13->blobs_).super_RepeatedPtrFieldBase.rep_[1].elements[0] +
                           0x18),iVar38 * iVar38 * 3 + iVar35);
      local_67c = *pfVar22;
      google::protobuf::RepeatedField<float>::Set(pRVar1,iVar35,&local_67c);
      iVar35 = iVar35 + 1;
    } while (iVar11 != iVar35);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_658._M_dataplus._M_p != &local_658.field_2) {
    operator_delete(local_658._M_dataplus._M_p,local_658.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_638._M_dataplus._M_p != &local_638.field_2) {
    operator_delete(local_638._M_dataplus._M_p,local_638.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_618);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_678._M_dataplus._M_p != &local_678.field_2) {
    operator_delete(local_678._M_dataplus._M_p,local_678.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_718._M_dataplus._M_p != &local_718.field_2) {
    operator_delete(local_718._M_dataplus._M_p,local_718.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_5f8);
  return;
}

Assistant:

void CoreMLConverter::convertCaffeLSTM(CoreMLConverter::ConvertLayerParameters layerParameters) {
    
    int layerId = *layerParameters.layerId;
    const caffe::LayerParameter& caffeLayer = layerParameters.prototxt.layer(layerId);
    int layerIdWeights = CoreMLConverter::getLayerIndex(caffeLayer,layerParameters.mapCaffeLayerNamesToIndex);
    const caffe::LayerParameter& caffeLayerWeights = layerParameters.protoweights.layer(layerIdWeights);
    std::map<std::string, std::string>& mappingDataBlobNames = layerParameters.mappingDataBlobNames;

    //Write Layer metadata
    auto* nnWrite = layerParameters.nnWrite;
    Specification::NeuralNetworkLayer* specLayer = nnWrite->Add();
    std::vector<std::string> bottom;
    // Caffe LSTM layers take an extra input, a binary indicator to show where one input sequence
    // ends and the next begins in order to reset the hidden state for this occurrence.
    // Since we don't support this, we need to ignore this input
    bottom.push_back(caffeLayer.bottom(0));
    // Now, we need to add the addtional hidden inputs and outputs
    std::string hnamein = "LSTM_" + std::to_string(layerId) + "_h_in";
    bottom.push_back(hnamein);
    std::string cnamein = "LSTM_" + std::to_string(layerId) + "_c_in";
    bottom.push_back(cnamein);
    
    // Same deal for top names
    std::vector<std::string> top;
    top.push_back(caffeLayer.top(0));
    std::string hnameout = "LSTM_" + std::to_string(layerId) + "_h_out";
    top.push_back(hnameout);
    std::string cnameout = "LSTM_" + std::to_string(layerId) + "_c_out";
    top.push_back(cnameout);
    
    CoreMLConverter::convertCaffeMetadata(caffeLayer.name(),
                                         bottom, top,
                                         nnWrite, mappingDataBlobNames);
    
    const caffe::RecurrentParameter& caffeLayerParams = caffeLayer.recurrent_param();
    uint32_t hidden_size = caffeLayerParams.num_output();
    layerParameters.mapBlobNameToDimensions[hnamein] = std::vector<int64_t>(1, hidden_size);
    layerParameters.mapBlobNameToDimensions[cnamein] = std::vector<int64_t>(1, hidden_size);
    
    
    //***************** Some Error Checking in Caffe Proto **********
    if (caffeLayerWeights.blobs_size()==0){
        CoreMLConverter::errorInCaffeProto("Weights not found in the caffemodel file", caffeLayer.name(), "Recurrent");
    }
    if (hidden_size<=0) {
        CoreMLConverter::errorInCaffeProto("'num_output' cannot be non-positive",caffeLayer.name(),"Recurrent");
    }
    if (caffeLayerParams.expose_hidden()) {
        CoreMLConverter::unsupportedCaffeParrameterWithOption("expose_hidden",caffeLayer.name(),"Recurrent","True");
    }
    //**************************************************************

    Specification::UniDirectionalLSTMLayerParams* specLayerParams = specLayer->mutable_unidirectionallstm();

    // Caffe is stored input, bias, Hidden
    int64_t input_size = caffeLayerWeights.blobs(0).shape().dim(1);

    specLayerParams->set_outputvectorsize(static_cast<uint64_t>(hidden_size));
    assert(input_size >= 0);
    specLayerParams->set_inputvectorsize(static_cast<uint64_t>(input_size));
    
    specLayerParams->mutable_params()->set_sequenceoutput(false);
    // Caffe doesn't support forget bias, so it won't come up
    specLayerParams->mutable_params()->set_forgetbias(false);
    specLayerParams->mutable_params()->set_hasbiasvectors(true);
    
    //Add default set of non-linearities
    specLayerParams->add_activations()->mutable_sigmoid();
    specLayerParams->add_activations()->mutable_tanh();
    specLayerParams->add_activations()->mutable_tanh();
    
    //Copy weights
    //Input Weight Matrices
    int blobSize = caffeLayerWeights.blobs(0).data_size();
    int64_t expectedSize = 4*((int64_t)hidden_size)*input_size;
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    
    ::google::protobuf::RepeatedField<float>* Wi = specLayerParams->mutable_weightparams()->mutable_inputgateweightmatrix()->mutable_floatvalue();
    Wi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wi->Set(i,caffeLayerWeights.blobs(0).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Wf = specLayerParams->mutable_weightparams()->mutable_forgetgateweightmatrix()->mutable_floatvalue();
    Wf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wf->Set(i,caffeLayerWeights.blobs(0).data(i + static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wo = specLayerParams->mutable_weightparams()->mutable_outputgateweightmatrix()->mutable_floatvalue();
    Wo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wo->Set(i,caffeLayerWeights.blobs(0).data(i + 2*static_cast<int>(hidden_size*input_size)));
    }
    ::google::protobuf::RepeatedField<float>* Wz = specLayerParams->mutable_weightparams()->mutable_blockinputweightmatrix()->mutable_floatvalue();
    Wz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Wz->Set(i,caffeLayerWeights.blobs(0).data(i + 3*static_cast<int>(hidden_size*input_size)));
    }
    
    //biases
    blobSize = caffeLayerWeights.blobs(1).data_size();
    expectedSize = 4*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* bi = specLayerParams->mutable_weightparams()->mutable_inputgatebiasvector()->mutable_floatvalue();
    bi->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bi->Set(i,caffeLayerWeights.blobs(1).data(i));
    }
    ::google::protobuf::RepeatedField<float>* bf = specLayerParams->mutable_weightparams()->mutable_forgetgatebiasvector()->mutable_floatvalue();
    bf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bf->Set(i,caffeLayerWeights.blobs(1).data(i + static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bo = specLayerParams->mutable_weightparams()->mutable_outputgatebiasvector()->mutable_floatvalue();
    bo->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bo->Set(i,caffeLayerWeights.blobs(1).data(i + 2*static_cast<int>(hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* bz = specLayerParams->mutable_weightparams()->mutable_blockinputbiasvector()->mutable_floatvalue();
    bz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        bz->Set(i,caffeLayerWeights.blobs(1).data(i + 3*static_cast<int>(hidden_size)));
    }
    
    
    //Recursion matrices
    blobSize = caffeLayerWeights.blobs(2).data_size();
    expectedSize = 4*((int64_t)hidden_size)*((int64_t)hidden_size);
    if (blobSize != expectedSize) {
        CoreMLConverter::errorInCaffeProto("Expected blob size = "+std::to_string(expectedSize)+" but found blob of size = "+std::to_string(blobSize)+" in caffe"
                          , caffeLayer.name(), "Recurrent");
    }
    ::google::protobuf::RepeatedField<float>* Ri = specLayerParams->mutable_weightparams()->mutable_inputgaterecursionmatrix()->mutable_floatvalue();
    Ri->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ri->Set(i,caffeLayerWeights.blobs(2).data(i));
    }
    ::google::protobuf::RepeatedField<float>* Rf = specLayerParams->mutable_weightparams()->mutable_forgetgaterecursionmatrix()->mutable_floatvalue();
    Rf->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rf->Set(i,caffeLayerWeights.blobs(2).data(i + static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Ro = specLayerParams->mutable_weightparams()->mutable_outputgaterecursionmatrix()->mutable_floatvalue();
    Ro->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Ro->Set(i,caffeLayerWeights.blobs(2).data(i + 2*static_cast<int>(hidden_size*hidden_size)));
    }
    ::google::protobuf::RepeatedField<float>* Rz = specLayerParams->mutable_weightparams()->mutable_blockinputrecursionmatrix()->mutable_floatvalue();
    Rz->Resize(blobSize/4, 0.0);
    for (int i=0; i<blobSize/4; i++){
        Rz->Set(i,caffeLayerWeights.blobs(2).data(i + 3*static_cast<int>(hidden_size*hidden_size)));
    }
}